

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalCTE,std::__cxx11::string&,unsigned_long&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,unsigned_long&>
          (PhysicalPlan *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long *args_1,vector<duckdb::LogicalType,_true> *args_2,PhysicalOperator *args_3,
          PhysicalOperator *args_4,unsigned_long *args_5)

{
  idx_t table_index;
  PhysicalCTE *this_00;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_70;
  reference_wrapper<duckdb::PhysicalOperator> local_58;
  string local_50;
  
  this_00 = (PhysicalCTE *)ArenaAllocator::AllocateAligned(&this->arena,0xd0);
  ::std::__cxx11::string::string((string *)&local_50,(string *)args);
  table_index = *args_1;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_70,
             &args_2->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  PhysicalCTE::PhysicalCTE
            (this_00,&local_50,table_index,(vector<duckdb::LogicalType,_true> *)&local_70,args_3,
             args_4,*args_5);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  local_58._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_58);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}